

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

void __thiscall wasm::Debug::FuncAddrMap::FuncAddrMap(FuncAddrMap *this,Module *wasm)

{
  pointer puVar1;
  mapped_type pFVar2;
  undefined8 in_RAX;
  mapped_type *ppFVar3;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar4;
  undefined8 uStack_38;
  
  (this->startMap)._M_h._M_buckets = &(this->startMap)._M_h._M_single_bucket;
  (this->startMap)._M_h._M_bucket_count = 1;
  (this->startMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->startMap)._M_h._M_element_count = 0;
  (this->startMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->startMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->startMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->endMap)._M_h._M_buckets = &(this->endMap)._M_h._M_single_bucket;
  (this->endMap)._M_h._M_bucket_count = 1;
  (this->endMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->endMap)._M_h._M_element_count = 0;
  (this->endMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->endMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->endMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    uStack_38 = in_RAX;
    do {
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      ppFVar3 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&(pFVar2->funcLocation).start);
      *ppFVar3 = pFVar2;
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      ppFVar3 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this,&(pFVar2->funcLocation).declarations);
      *ppFVar3 = pFVar2;
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      uStack_38 = CONCAT44((pFVar2->funcLocation).end - 1,(undefined4)uStack_38);
      ppFVar3 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->endMap,(key_type *)((long)&uStack_38 + 4));
      *ppFVar3 = pFVar2;
      pFVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      ppFVar3 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->endMap,&(pFVar2->funcLocation).end);
      *ppFVar3 = pFVar2;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  return;
}

Assistant:

FuncAddrMap(const Module& wasm) {
    for (auto& func : wasm.functions) {
      startMap[func->funcLocation.start] = func.get();
      startMap[func->funcLocation.declarations] = func.get();
      endMap[func->funcLocation.end - 1] = func.get();
      endMap[func->funcLocation.end] = func.get();
    }
  }